

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_CCtxParams_init_internal
               (ZSTD_CCtx_params *cctxParams,ZSTD_parameters *params,int compressionLevel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_strategy ZVar7;
  int iVar8;
  ZSTD_useRowMatchFinderMode_e ZVar9;
  
  memset(cctxParams,0,0xb0);
  uVar1 = (params->cParams).chainLog;
  uVar2 = (params->cParams).hashLog;
  uVar3 = (params->cParams).searchLog;
  uVar4 = (params->cParams).searchLog;
  uVar5 = (params->cParams).minMatch;
  uVar6 = (params->cParams).targetLength;
  ZVar7 = (params->cParams).strategy;
  (cctxParams->cParams).windowLog = (params->cParams).windowLog;
  (cctxParams->cParams).chainLog = uVar1;
  (cctxParams->cParams).hashLog = uVar2;
  (cctxParams->cParams).searchLog = uVar3;
  (cctxParams->cParams).searchLog = uVar4;
  (cctxParams->cParams).minMatch = uVar5;
  (cctxParams->cParams).targetLength = uVar6;
  (cctxParams->cParams).strategy = ZVar7;
  iVar8 = (params->fParams).checksumFlag;
  (cctxParams->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
  (cctxParams->fParams).checksumFlag = iVar8;
  (cctxParams->fParams).noDictIDFlag = (params->fParams).noDictIDFlag;
  cctxParams->compressionLevel = compressionLevel;
  ZVar9 = ZSTD_resolveRowMatchFinderMode(ZSTD_urm_auto,&params->cParams);
  cctxParams->useRowMatchFinder = ZVar9;
  return;
}

Assistant:

static void ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params* cctxParams, ZSTD_parameters const* params, int compressionLevel)
{
    assert(!ZSTD_checkCParams(params->cParams));
    ZSTD_memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->cParams = params->cParams;
    cctxParams->fParams = params->fParams;
    /* Should not matter, as all cParams are presumed properly defined.
     * But, set it for tracing anyway.
     */
    cctxParams->compressionLevel = compressionLevel;
    cctxParams->useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams->useRowMatchFinder, &params->cParams);
    DEBUGLOG(4, "ZSTD_CCtxParams_init_internal: useRowMatchFinder=%d", cctxParams->useRowMatchFinder);
}